

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

void * __thiscall rapidxml::memory_pool<char>::allocate_aligned(memory_pool<char> *this,size_t size)

{
  char *ptr;
  char *pcVar1;
  header *new_header;
  char *pool;
  char *raw_memory;
  size_t alloc_size;
  size_t pool_size;
  char *result;
  size_t size_local;
  memory_pool<char> *this_local;
  
  pool_size = (size_t)align(this,this->m_ptr);
  if (this->m_end < (char *)(pool_size + size)) {
    alloc_size = 0x10000;
    if (0x10000 < size) {
      alloc_size = size;
    }
    ptr = allocate_raw(this,alloc_size + 0x16);
    pcVar1 = align(this,ptr);
    *(char **)pcVar1 = this->m_begin;
    this->m_begin = ptr;
    this->m_ptr = pcVar1 + 8;
    this->m_end = ptr + alloc_size + 0x16;
    pool_size = (size_t)align(this,this->m_ptr);
  }
  this->m_ptr = (char *)(pool_size + size);
  return (void *)pool_size;
}

Assistant:

void *allocate_aligned(std::size_t size)
        {
            // Calculate aligned pointer
            char *result = align(m_ptr);

            // If not enough memory left in current pool, allocate a new pool
            if (result + size > m_end)
            {
                // Calculate required pool size (may be bigger than RAPIDXML_DYNAMIC_POOL_SIZE)
                std::size_t pool_size = RAPIDXML_DYNAMIC_POOL_SIZE;
                if (pool_size < size)
                    pool_size = size;
                
                // Allocate
                std::size_t alloc_size = sizeof(header) + (2 * RAPIDXML_ALIGNMENT - 2) + pool_size;     // 2 alignments required in worst case: one for header, one for actual allocation
                char *raw_memory = allocate_raw(alloc_size);
                    
                // Setup new pool in allocated memory
                char *pool = align(raw_memory);
                header *new_header = reinterpret_cast<header *>(pool);
                new_header->previous_begin = m_begin;
                m_begin = raw_memory;
                m_ptr = pool + sizeof(header);
                m_end = raw_memory + alloc_size;

                // Calculate aligned pointer again using new pool
                result = align(m_ptr);
            }

            // Update pool and return aligned pointer
            m_ptr = result + size;
            return result;
        }